

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ActivationParams::MergeFrom(ActivationParams *this,ActivationParams *from)

{
  NonlinearityTypeCase NVar1;
  LogMessage *other;
  ActivationLinear *this_00;
  ActivationLinear *from_00;
  ActivationReLU *this_01;
  ActivationReLU *from_01;
  ActivationLeakyReLU *this_02;
  ActivationLeakyReLU *from_02;
  ActivationThresholdedReLU *this_03;
  ActivationThresholdedReLU *from_03;
  ActivationPReLU *this_04;
  ActivationPReLU *from_04;
  ActivationTanh *this_05;
  ActivationTanh *from_05;
  ActivationScaledTanh *this_06;
  ActivationScaledTanh *from_06;
  ActivationSigmoid *this_07;
  ActivationSigmoid *from_07;
  ActivationSigmoidHard *this_08;
  ActivationSigmoidHard *from_08;
  ActivationELU *this_09;
  ActivationELU *from_09;
  ActivationSoftsign *this_10;
  ActivationSoftsign *from_10;
  ActivationSoftplus *this_11;
  ActivationSoftplus *from_11;
  ActivationParametricSoftplus *this_12;
  ActivationParametricSoftplus *from_12;
  InternalMetadataWithArenaLite *this_13;
  double __x;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  ActivationParams *local_58;
  ActivationParams *from_local;
  ActivationParams *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x1977);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_13 = &this->_internal_metadata_;
  this_local = (ActivationParams *)&local_58->_internal_metadata_;
  local_40 = this_13;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_13,&local_20->unknown_fields);
  }
  NVar1 = NonlinearityType_case(local_58);
  switch(NVar1) {
  case NONLINEARITYTYPE_NOT_SET:
    break;
  case kLinear:
    this_00 = mutable_linear(this);
    from_00 = linear(local_58);
    ActivationLinear::MergeFrom(this_00,from_00);
    break;
  case kReLU:
    this_01 = mutable_relu(this);
    from_01 = relu(local_58);
    ActivationReLU::MergeFrom(this_01,from_01);
    break;
  case kLeakyReLU:
    this_02 = mutable_leakyrelu(this);
    from_02 = leakyrelu(local_58);
    ActivationLeakyReLU::MergeFrom(this_02,from_02);
    break;
  case kThresholdedReLU:
    this_03 = mutable_thresholdedrelu(this);
    from_03 = thresholdedrelu(local_58);
    ActivationThresholdedReLU::MergeFrom(this_03,from_03);
    break;
  case kPReLU:
    this_04 = mutable_prelu(this);
    from_04 = prelu(local_58);
    ActivationPReLU::MergeFrom(this_04,from_04);
    break;
  case kTanh:
    this_05 = mutable_tanh(this);
    tanh(local_58,__x);
    ActivationTanh::MergeFrom(this_05,from_05);
    break;
  case kScaledTanh:
    this_06 = mutable_scaledtanh(this);
    from_06 = scaledtanh(local_58);
    ActivationScaledTanh::MergeFrom(this_06,from_06);
    break;
  case kSigmoid:
    this_07 = mutable_sigmoid(this);
    from_07 = sigmoid(local_58);
    ActivationSigmoid::MergeFrom(this_07,from_07);
    break;
  case kSigmoidHard:
    this_08 = mutable_sigmoidhard(this);
    from_08 = sigmoidhard(local_58);
    ActivationSigmoidHard::MergeFrom(this_08,from_08);
    break;
  case kELU:
    this_09 = mutable_elu(this);
    from_09 = elu(local_58);
    ActivationELU::MergeFrom(this_09,from_09);
    break;
  case kSoftsign:
    this_10 = mutable_softsign(this);
    from_10 = softsign(local_58);
    ActivationSoftsign::MergeFrom(this_10,from_10);
    break;
  case kSoftplus:
    this_11 = mutable_softplus(this);
    from_11 = softplus(local_58);
    ActivationSoftplus::MergeFrom(this_11,from_11);
    break;
  case kParametricSoftplus:
    this_12 = mutable_parametricsoftplus(this);
    from_12 = parametricsoftplus(local_58);
    ActivationParametricSoftplus::MergeFrom(this_12,from_12);
  }
  return;
}

Assistant:

void ActivationParams::MergeFrom(const ActivationParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ActivationParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.NonlinearityType_case()) {
    case kLinear: {
      mutable_linear()->::CoreML::Specification::ActivationLinear::MergeFrom(from.linear());
      break;
    }
    case kReLU: {
      mutable_relu()->::CoreML::Specification::ActivationReLU::MergeFrom(from.relu());
      break;
    }
    case kLeakyReLU: {
      mutable_leakyrelu()->::CoreML::Specification::ActivationLeakyReLU::MergeFrom(from.leakyrelu());
      break;
    }
    case kThresholdedReLU: {
      mutable_thresholdedrelu()->::CoreML::Specification::ActivationThresholdedReLU::MergeFrom(from.thresholdedrelu());
      break;
    }
    case kPReLU: {
      mutable_prelu()->::CoreML::Specification::ActivationPReLU::MergeFrom(from.prelu());
      break;
    }
    case kTanh: {
      mutable_tanh()->::CoreML::Specification::ActivationTanh::MergeFrom(from.tanh());
      break;
    }
    case kScaledTanh: {
      mutable_scaledtanh()->::CoreML::Specification::ActivationScaledTanh::MergeFrom(from.scaledtanh());
      break;
    }
    case kSigmoid: {
      mutable_sigmoid()->::CoreML::Specification::ActivationSigmoid::MergeFrom(from.sigmoid());
      break;
    }
    case kSigmoidHard: {
      mutable_sigmoidhard()->::CoreML::Specification::ActivationSigmoidHard::MergeFrom(from.sigmoidhard());
      break;
    }
    case kELU: {
      mutable_elu()->::CoreML::Specification::ActivationELU::MergeFrom(from.elu());
      break;
    }
    case kSoftsign: {
      mutable_softsign()->::CoreML::Specification::ActivationSoftsign::MergeFrom(from.softsign());
      break;
    }
    case kSoftplus: {
      mutable_softplus()->::CoreML::Specification::ActivationSoftplus::MergeFrom(from.softplus());
      break;
    }
    case kParametricSoftplus: {
      mutable_parametricsoftplus()->::CoreML::Specification::ActivationParametricSoftplus::MergeFrom(from.parametricsoftplus());
      break;
    }
    case NONLINEARITYTYPE_NOT_SET: {
      break;
    }
  }
}